

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::WriteSignal(cmServer *this,string *name,Value *data)

{
  bool bVar1;
  Value *pVVar2;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_70;
  undefined1 local_48 [8];
  Value obj;
  Value *data_local;
  string *name_local;
  cmServer *this_local;
  
  obj.limit_ = (ptrdiff_t)data;
  bVar1 = Json::Value::isObject(data);
  if (!bVar1) {
    __assert_fail("data.isObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx"
                  ,0x171,
                  "void cmServer::WriteSignal(const std::string &, const Json::Value &) const");
  }
  Json::Value::Value((Value *)local_48,(Value *)obj.limit_);
  Json::Value::Value(&local_70,&kSIGNAL_TYPE_abi_cxx11_);
  pVVar2 = Json::Value::operator[]((Value *)local_48,&kTYPE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_a8,"");
  pVVar2 = Json::Value::operator[]((Value *)local_48,&kREPLY_TO_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_a8);
  Json::Value::~Value(&local_a8);
  Json::Value::Value(&local_d0,"");
  pVVar2 = Json::Value::operator[]((Value *)local_48,&kCOOKIE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_d0);
  Json::Value::~Value(&local_d0);
  Json::Value::Value(&local_f8,name);
  pVVar2 = Json::Value::operator[]((Value *)local_48,&kNAME_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_f8);
  Json::Value::~Value(&local_f8);
  WriteJsonObject(this,(Value *)local_48,(DebugInfo *)0x0);
  Json::Value::~Value((Value *)local_48);
  return;
}

Assistant:

void cmServer::WriteSignal(const std::string& name,
                           const Json::Value& data) const
{
  assert(data.isObject());
  Json::Value obj = data;
  obj[kTYPE_KEY] = kSIGNAL_TYPE;
  obj[kREPLY_TO_KEY] = "";
  obj[kCOOKIE_KEY] = "";
  obj[kNAME_KEY] = name;

  WriteJsonObject(obj, nullptr);
}